

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

void art_iterator_insert(art_iterator_t *iterator,art_key_chunk_t *key,art_val_t val)

{
  art_val_t in_RDX;
  art_key_chunk_t *in_RSI;
  art_t *in_RDI;
  art_key_chunk_t *in_stack_00000018;
  art_iterator_t *in_stack_00000020;
  art_ref_t in_stack_00000028;
  
  art_insert(in_RDI,in_RSI,in_RDX);
  *(undefined1 *)((long)in_RDI->first_free + 0x11) = 0;
  *(undefined1 *)(in_RDI->first_free + 2) = 0;
  art_node_iterator_lower_bound(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void art_iterator_insert(art_iterator_t *iterator, const art_key_chunk_t *key,
                         art_val_t val) {
    // TODO: This can likely be faster.
    art_insert(iterator->art, key, val);
    assert(iterator->art->root != CROARING_ART_NULL_REF);
    iterator->frame = 0;
    iterator->depth = 0;
    art_node_iterator_lower_bound(iterator->art->root, iterator, key);
}